

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O0

unique_ptr<Sock,_std::default_delete<Sock>_>
ConnectThroughProxy(Proxy *proxy,string *dest,uint16_t port,bool *proxy_connection_failed)

{
  long lVar1;
  bool bVar2;
  Proxy *in_RSI;
  _Head_base<0UL,_Sock_*,_false> in_RDI;
  undefined1 *in_R8;
  long in_FS_OFFSET;
  unique_ptr<Sock,_std::default_delete<Sock>_> sock;
  Sock *in_stack_000000c8;
  ProxyCredentials random_auth;
  uint16_t in_stack_00000486;
  ProxyCredentials *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  __atomic_base<int> *in_stack_ffffffffffffff00;
  int *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Proxy::Connect(in_RSI);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<Sock,_std::default_delete<Sock>_> *)in_stack_fffffffffffffee8);
  if (bVar2) {
    if ((in_RSI->m_randomize_credentials & 1U) == 0) {
      std::unique_ptr<Sock,_std::default_delete<Sock>_>::operator*
                ((unique_ptr<Sock,_std::default_delete<Sock>_> *)
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      bVar2 = Socks5((string *)random_auth.username._M_string_length,in_stack_00000486,
                     (ProxyCredentials *)random_auth.username._M_dataplus._M_p,in_stack_000000c8);
      in_stack_fffffffffffffefc = CONCAT13(bVar2,(int3)in_stack_fffffffffffffefc);
      if (!bVar2) {
        std::unique_ptr<Sock,std::default_delete<Sock>>::unique_ptr<std::default_delete<Sock>,void>
                  ((unique_ptr<Sock,_std::default_delete<Sock>_> *)in_stack_fffffffffffffee8);
        goto LAB_00e0c9a9;
      }
    }
    else {
      ProxyCredentials::ProxyCredentials(in_stack_fffffffffffffee8);
      std::__atomic_base<int>::operator++(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      tinyformat::format<int>
                ((char *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
                 in_stack_ffffffffffffff10);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_ffffffffffffff48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_RDI._M_head_impl);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                 in_stack_fffffffffffffef0);
      std::__cxx11::string::~string(&in_stack_fffffffffffffee8->username);
      std::unique_ptr<Sock,_std::default_delete<Sock>_>::operator*
                ((unique_ptr<Sock,_std::default_delete<Sock>_> *)
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      bVar2 = Socks5((string *)random_auth.username._M_string_length,in_stack_00000486,
                     (ProxyCredentials *)random_auth.username._M_dataplus._M_p,in_stack_000000c8);
      if (!bVar2) {
        std::unique_ptr<Sock,std::default_delete<Sock>>::unique_ptr<std::default_delete<Sock>,void>
                  ((unique_ptr<Sock,_std::default_delete<Sock>_> *)in_stack_fffffffffffffee8);
      }
      ProxyCredentials::~ProxyCredentials(in_stack_fffffffffffffee8);
      if (!bVar2) goto LAB_00e0c9a9;
    }
    std::unique_ptr<Sock,_std::default_delete<Sock>_>::unique_ptr
              ((unique_ptr<Sock,_std::default_delete<Sock>_> *)in_stack_fffffffffffffee8,
               (unique_ptr<Sock,_std::default_delete<Sock>_> *)0xe0c9a1);
  }
  else {
    *in_R8 = 1;
    std::unique_ptr<Sock,std::default_delete<Sock>>::unique_ptr<std::default_delete<Sock>,void>
              ((unique_ptr<Sock,_std::default_delete<Sock>_> *)in_stack_fffffffffffffee8);
  }
LAB_00e0c9a9:
  std::unique_ptr<Sock,_std::default_delete<Sock>_>::~unique_ptr
            ((unique_ptr<Sock,_std::default_delete<Sock>_> *)
             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
         (tuple<Sock_*,_std::default_delete<Sock>_>)in_RDI._M_head_impl;
}

Assistant:

std::unique_ptr<Sock> ConnectThroughProxy(const Proxy& proxy,
                                          const std::string& dest,
                                          uint16_t port,
                                          bool& proxy_connection_failed)
{
    // first connect to proxy server
    auto sock = proxy.Connect();
    if (!sock) {
        proxy_connection_failed = true;
        return {};
    }

    // do socks negotiation
    if (proxy.m_randomize_credentials) {
        ProxyCredentials random_auth;
        static std::atomic_int counter(0);
        random_auth.username = random_auth.password = strprintf("%i", counter++);
        if (!Socks5(dest, port, &random_auth, *sock)) {
            return {};
        }
    } else {
        if (!Socks5(dest, port, nullptr, *sock)) {
            return {};
        }
    }
    return sock;
}